

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_limit.cpp
# Opt level: O1

bool duckdb::PhysicalLimit::HandleOffset
               (DataChunk *input,idx_t *current_offset,idx_t offset,idx_t limit)

{
  idx_t iVar1;
  undefined1 auVar2 [16];
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  idx_t iVar6;
  sel_t sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  SelectionVector sel;
  SelectionVector local_48;
  long lVar10;
  
  iVar1 = input->count;
  uVar4 = *current_offset;
  if (uVar4 < offset) {
    if (uVar4 + iVar1 <= offset) {
      bVar3 = false;
      goto LAB_01551844;
    }
    uVar5 = (uVar4 - offset) + iVar1;
    if (limit < uVar5) {
      uVar5 = limit;
    }
    SelectionVector::SelectionVector(&local_48,0x800);
    auVar2 = _DAT_01dd7b40;
    if (uVar5 != 0) {
      lVar10 = uVar5 - 1;
      auVar8._8_4_ = (int)lVar10;
      auVar8._0_8_ = lVar10;
      auVar8._12_4_ = (int)((ulong)lVar10 >> 0x20);
      sVar7 = (int)offset - (int)uVar4;
      uVar4 = 0;
      auVar8 = auVar8 ^ _DAT_01dd7b40;
      auVar9 = _DAT_01dd7b30;
      do {
        auVar11 = auVar9 ^ auVar2;
        if ((bool)(~(auVar11._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar11._0_4_ ||
                    auVar8._4_4_ < auVar11._4_4_) & 1)) {
          local_48.sel_vector[uVar4] = sVar7;
        }
        if ((auVar11._12_4_ != auVar8._12_4_ || auVar11._8_4_ <= auVar8._8_4_) &&
            auVar11._12_4_ <= auVar8._12_4_) {
          local_48.sel_vector[uVar4 + 1] = sVar7 + 1;
        }
        uVar4 = uVar4 + 2;
        lVar10 = auVar9._8_8_;
        auVar9._0_8_ = auVar9._0_8_ + 2;
        auVar9._8_8_ = lVar10 + 2;
        sVar7 = sVar7 + 2;
      } while ((uVar5 + 1 & 0xfffffffffffffffe) != uVar4);
    }
    DataChunk::Slice(input,input,&local_48,uVar5,0);
    if (local_48.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
  }
  else {
    uVar5 = offset + limit;
    if (limit == 0xffffffffffffffff) {
      uVar5 = 0xffffffffffffffff;
    }
    iVar6 = uVar5 - uVar4;
    if (uVar4 + iVar1 < uVar5) {
      iVar6 = iVar1;
    }
    DataChunk::Reference(input,input);
    input->count = iVar6;
  }
  bVar3 = true;
LAB_01551844:
  *current_offset = *current_offset + iVar1;
  return bVar3;
}

Assistant:

bool PhysicalLimit::HandleOffset(DataChunk &input, idx_t &current_offset, idx_t offset, idx_t limit) {
	idx_t max_element = limit + offset;
	if (limit == DConstants::INVALID_INDEX) {
		max_element = DConstants::INVALID_INDEX;
	}
	idx_t input_size = input.size();
	if (current_offset < offset) {
		// we are not yet at the offset point
		if (current_offset + input.size() > offset) {
			// however we will reach it in this chunk
			// we have to copy part of the chunk with an offset
			idx_t start_position = offset - current_offset;
			auto chunk_count = MinValue<idx_t>(limit, input.size() - start_position);
			SelectionVector sel(STANDARD_VECTOR_SIZE);
			for (idx_t i = 0; i < chunk_count; i++) {
				sel.set_index(i, start_position + i);
			}
			// set up a slice of the input chunks
			input.Slice(input, sel, chunk_count);
		} else {
			current_offset += input_size;
			return false;
		}
	} else {
		// have to copy either the entire chunk or part of it
		idx_t chunk_count;
		if (current_offset + input.size() >= max_element) {
			// have to limit the count of the chunk
			chunk_count = max_element - current_offset;
		} else {
			// we copy the entire chunk
			chunk_count = input.size();
		}
		// instead of copying we just change the pointer in the current chunk
		input.Reference(input);
		input.SetCardinality(chunk_count);
	}

	current_offset += input_size;
	return true;
}